

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  LogMessage *pLVar4;
  LogFinisher local_f2;
  byte local_f1;
  LogMessage local_f0;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  Extension *local_28;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_28);
  if (bVar1) {
    local_28->type = descriptor_local._3_1_;
    CVar2 = anon_unknown_22::cpp_type(local_28->type);
    local_61 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x241);
      local_61 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(local_75,pLVar4);
    }
    if ((local_61 & 1) != 0) {
      LogMessage::~LogMessage(&local_60);
    }
    local_28->is_repeated = false;
    pbVar3 = Arena::Create<std::__cxx11::string>(this->arena_);
    (local_28->field_0).string_value = pbVar3;
  }
  else {
    local_b1 = 0;
    if ((local_28->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x245);
      local_b1 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_b2,pLVar4);
    }
    if ((local_b1 & 1) != 0) {
      LogMessage::~LogMessage(&local_b0);
    }
    CVar2 = anon_unknown_22::cpp_type(local_28->type);
    local_f1 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x245);
      local_f1 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_f0,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_f2,pLVar4);
    }
    if ((local_f1 & 1) != 0) {
      LogMessage::~LogMessage(&local_f0);
    }
  }
  local_28->field_0xa = local_28->field_0xa & 0xf0;
  return (string *)(local_28->field_0).int64_t_value;
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = Arena::Create<std::string>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}